

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitvec.c
# Opt level: O2

size_t bitvec_count_set(bitvec_t *vec,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  bitvec_t *pbVar3;
  long lVar4;
  
  sVar1 = 0;
  pbVar3 = vec;
  for (uVar2 = 0; uVar2 != len >> 5; uVar2 = uVar2 + 1) {
    if (*pbVar3 != 0) {
      for (lVar4 = 0; lVar4 != 0x20; lVar4 = lVar4 + 1) {
        sVar1 = sVar1 + ((*pbVar3 >> ((uint)lVar4 & 0x1f) & 1) != 0);
      }
    }
    pbVar3 = pbVar3 + 1;
  }
  for (uVar2 = 0; ((uint)len & 0x1f) != uVar2; uVar2 = uVar2 + 1) {
    sVar1 = sVar1 + ((vec[len >> 5] >> ((uint)uVar2 & 0x1f) & 1) != 0);
  }
  return sVar1;
}

Assistant:

size_t
bitvec_count_set(bitvec_t *vec, size_t len)
{
    size_t words, bits, w, b, n;
    bitvec_t *v;

    words = len / BITVEC_BITS;
    bits = len % BITVEC_BITS;
    v = vec;
    n = 0;
    for (w = 0; w < words; ++w, ++v) {
        if (*v == 0)
            continue;
        for (b = 0; b < BITVEC_BITS; ++b)
            if (*v & (1<<b))
                ++n;
    }
    for (b = 0; b < bits; ++b)
        if (*v & (1<<b))
            ++n;

    return n;
}